

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_fortify_weapon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  OBJ_DATA *in_RCX;
  OBJ_DATA *in_RDX;
  int in_ESI;
  int in_EDI;
  int olddam;
  int oldhit;
  int diff;
  int chance;
  bool hitbonus;
  bool dambonus;
  bool hitfound;
  bool damfound;
  OBJ_APPLY_DATA *damapp;
  OBJ_APPLY_DATA *hitapp;
  OBJ_DATA *weapon;
  undefined1 in_stack_000012d2;
  undefined1 in_stack_000012d3;
  int in_stack_000012d4;
  int in_stack_000012d8;
  int in_stack_000012dc;
  CHAR_DATA *in_stack_000012e0;
  CHAR_DATA *in_stack_000012e8;
  int in_stack_00001308;
  int in_stack_00001310;
  char *in_stack_00001318;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  OBJ_DATA *in_stack_ffffffffffffff80;
  int local_4c;
  int local_48;
  int local_40;
  bool local_3b;
  OBJ_APPLY_DATA *local_38;
  OBJ_APPLY_DATA *local_30;
  
  local_30 = (OBJ_APPLY_DATA *)0x0;
  local_38 = (OBJ_APPLY_DATA *)0x0;
  bVar2 = false;
  bVar1 = false;
  local_48 = 0;
  local_4c = 0;
  if (in_RCX->item_type == 5) {
    bVar3 = is_metal((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar3) {
      bVar3 = is_worn(in_RCX);
      if (bVar3) {
        send_to_char(in_stack_ffffffffffffff70,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else {
        iVar4 = (in_ESI - (in_RCX->value[2] + 1) * in_RCX->value[1]) * 4;
        local_40 = iVar4 + 0x32;
        if (in_RCX->pIndexData->limtotal == 0) {
          local_40 = iVar4 + 0x46;
        }
        if ((in_RCX->pIndexData->limtotal == 1) || (in_RCX->pIndexData->limtotal == 2)) {
          local_40 = local_40 + -0x32;
        }
        if ((2 < in_RCX->pIndexData->limtotal) && (in_RCX->pIndexData->limtotal < 0x15)) {
          local_40 = local_40 - (int)((float)(int)in_RCX->pIndexData->limtotal * -2.5 + 50.0);
        }
        iVar4 = number_percent();
        local_40 = local_40 - iVar4;
        if (local_40 < 0x33) {
          if (local_40 < 1) {
            if (-0x19 < local_40) {
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              return;
            }
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
            dice(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
            damage_new(in_stack_000012e8,in_stack_000012e0,in_stack_000012dc,in_stack_000012d8,
                       in_stack_000012d4,(bool)in_stack_000012d3,(bool)in_stack_000012d2,
                       in_stack_00001308,in_stack_00001310,in_stack_00001318);
            extract_obj(in_stack_ffffffffffffff80);
            return;
          }
          iVar4 = number_percent();
          bVar3 = iVar4 < 0x33;
          local_3b = !bVar3;
        }
        else {
          bVar3 = true;
          local_3b = true;
        }
        if (bVar3) {
          for (local_30 = in_RCX->apply; local_30 != (OBJ_APPLY_DATA *)0x0;
              local_30 = local_30->next) {
            if ((local_30->location == 0x12) && (local_30->type == in_EDI)) {
              bVar1 = true;
              local_48 = (int)local_30->modifier;
              break;
            }
          }
          if (!bVar1) {
            local_30 = new_apply_data();
            local_30->type = (short)in_EDI;
            local_30->location = 0x12;
            local_30->modifier = 0;
            local_30->next = in_RCX->apply;
            in_RCX->apply = local_30;
          }
        }
        if (local_3b) {
          for (local_38 = in_RCX->apply; local_38 != (OBJ_APPLY_DATA *)0x0;
              local_38 = local_38->next) {
            if ((local_38->location == 0x13) && (local_38->type == in_EDI)) {
              bVar2 = true;
              local_4c = (int)local_38->modifier;
              break;
            }
          }
          if (!bVar2) {
            local_38 = new_apply_data();
            local_38->type = (short)in_EDI;
            local_38->location = 0x13;
            local_38->modifier = 0;
            local_38->next = in_RCX->apply;
            in_RCX->apply = local_38;
          }
        }
        local_40 = (in_ESI - in_RCX->value[2] * in_RCX->value[1]) * 4 +
                   (0x32 - (int)((double)(local_4c + local_48) * 7.5));
        if ((bVar3) && (local_3b)) {
          local_40 = local_40 + 0x1e;
        }
        if ((10 < local_4c) || (10 < local_48)) {
          local_40 = 2;
        }
        if (bVar3) {
          iVar4 = number_percent();
          if (iVar4 < local_40) {
            local_30->modifier = local_30->modifier + 1;
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
          }
          else {
            iVar4 = number_percent();
            if (local_40 < iVar4) {
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              dice(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
              damage_new(in_stack_000012e8,in_stack_000012e0,in_stack_000012dc,in_stack_000012d8,
                         in_stack_000012d4,(bool)in_stack_000012d3,(bool)in_stack_000012d2,
                         in_stack_00001308,in_stack_00001310,in_stack_00001318);
              extract_obj(in_stack_ffffffffffffff80);
              return;
            }
            local_30->modifier = local_30->modifier + -1;
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
          }
        }
        if (local_3b) {
          iVar4 = number_percent();
          if (iVar4 < local_40) {
            local_38->modifier = local_38->modifier + 1;
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
            act(in_stack_ffffffffffffff70,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
          }
          else {
            iVar4 = number_percent();
            if (local_40 < iVar4) {
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              dice(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
              damage_new(in_stack_000012e8,in_stack_000012e0,in_stack_000012dc,in_stack_000012d8,
                         in_stack_000012d4,(bool)in_stack_000012d3,(bool)in_stack_000012d2,
                         in_stack_00001308,in_stack_00001310,in_stack_00001318);
              extract_obj(in_RDX);
            }
            else {
              local_38->modifier = local_38->modifier + -1;
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
              act(in_stack_ffffffffffffff70,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
            }
          }
        }
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffff70,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffff70,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  return;
}

Assistant:

void spell_fortify_weapon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *weapon = (OBJ_DATA *)vo;
	OBJ_APPLY_DATA *hitapp = nullptr, *damapp = nullptr;
	bool damfound = false, hitfound = false;
	bool dambonus = false, hitbonus = false;
	int chance = 50, diff, oldhit = 0, olddam = 0;

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only cast this on weapons.\n\r", ch);
		return;
	}

	if (!is_metal(weapon))
	{
		send_to_char("You can only fortify metallic weapons.\n\r", ch);
		return;
	}

	if (is_worn(weapon))
	{
		send_to_char("You must remove it to enchant it.\n\r", ch);
		return;
	}

	chance += (4 * (level - ((1 + weapon->value[2]) * weapon->value[1])));

	if (weapon->pIndexData->limtotal == 0)
		chance += 20;

	if (weapon->pIndexData->limtotal == 1 || weapon->pIndexData->limtotal == 2)
		chance -= 50;

	if (weapon->pIndexData->limtotal >= 3 && weapon->pIndexData->limtotal <= 20)
		chance -= (int)(50 - (2.5 * (float)weapon->pIndexData->limtotal));

	diff = chance - number_percent();

	if (diff > 50)
	{
		hitbonus = true;
		dambonus = true;
	}
	else if (diff > 0)
	{
		if (number_percent() > 50)
			dambonus = true;
		else
			hitbonus = true;
	}
	else if (diff > -25)
	{
		act("Your magic fails to take hold on $p.", ch, weapon, 0, TO_CHAR);
		act("$p hums very briefly in $n's hands.", ch, weapon, 0, TO_ROOM);
		return;
	}
	else
	{
		act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
		act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
		damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
		extract_obj(weapon);
		return;
	}

	if (hitbonus)
	{
		for (hitapp = weapon->apply; hitapp; hitapp = hitapp->next)
		{
			if (hitapp->location == APPLY_HITROLL && hitapp->type == sn)
			{
				hitfound = true;
				oldhit = hitapp->modifier;
				break;
			}
		}

		if (!hitfound)
		{
			hitapp = new_apply_data();
			hitapp->type = sn;
			hitapp->location = APPLY_HITROLL;
			hitapp->modifier = 0;
			hitapp->next = weapon->apply;
			weapon->apply = hitapp;
		}
	}

	if (dambonus)
	{
		for (damapp = weapon->apply; damapp; damapp = damapp->next)
		{
			if (damapp->location == APPLY_DAMROLL && damapp->type == sn)
			{
				damfound = true;
				olddam = damapp->modifier;
				break;
			}
		}

		if (!damfound)
		{
			damapp = new_apply_data();
			damapp->type = sn;
			damapp->location = APPLY_DAMROLL;
			damapp->modifier = 0;
			damapp->next = weapon->apply;
			weapon->apply = damapp;
		}
	}

	chance = 50;
	chance -= (int)(7.5 * (olddam + oldhit));
	chance += 4 * (level - ((weapon->value[2]) * weapon->value[1]));

	if (hitbonus && dambonus)
		chance += 30;

	if (olddam > 10 || oldhit > 10)
		chance = 2;

	if (hitbonus)
	{
		if (number_percent() < chance)
		{
			hitapp->modifier += 1;
			act("You feel $p's balance improve in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p rings with a light piercing tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				hitapp->modifier -= 1;
				act("You feel $p twist in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p emits a discordant tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}

	if (dambonus)
	{
		if (number_percent() < chance)
		{
			damapp->modifier += 1;
			act("You feel $p grow sturdier in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p flickers with a cerulean glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				damapp->modifier -= 1;
				act("You feel $p grow frail in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p flickers with a crimson glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}
}